

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O1

bool __thiscall
cmStringCommand::HandleCompareCommand
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pbVar3;
  pointer pcVar4;
  size_t __n;
  int iVar5;
  byte extraout_var;
  char *value;
  bool bVar6;
  string mode;
  string e;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  paVar2 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar2;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3) < 0x21) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,"sub-command COMPARE requires a mode to be specified.","");
    cmCommand::SetError(&this->super_cmCommand,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  pcVar4 = pbVar3[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar4,pcVar4 + pbVar3[1]._M_string_length);
  iVar5 = std::__cxx11::string::compare((char *)&local_70);
  if ((((iVar5 == 0) || (iVar5 = std::__cxx11::string::compare((char *)&local_70), iVar5 == 0)) ||
      (iVar5 = std::__cxx11::string::compare((char *)&local_70), iVar5 == 0)) ||
     (iVar5 = std::__cxx11::string::compare((char *)&local_70), iVar5 == 0)) {
    pbVar3 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (0x80 < (ulong)((long)(args->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3)) {
      pbVar1 = pbVar3 + 2;
      iVar5 = std::__cxx11::string::compare((char *)&local_70);
      if (iVar5 == 0) {
        std::__cxx11::string::compare((string *)pbVar1);
        bVar6 = (bool)(extraout_var >> 7);
LAB_00330e29:
        if (bVar6 != false) goto LAB_00330e2d;
LAB_00330e53:
        value = "0";
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&local_70);
        if (iVar5 == 0) {
          iVar5 = std::__cxx11::string::compare((string *)pbVar1);
          bVar6 = 0 < iVar5;
          goto LAB_00330e29;
        }
        iVar5 = std::__cxx11::string::compare((char *)&local_70);
        __n = pbVar3[2]._M_string_length;
        if (iVar5 != 0) {
          if (__n != pbVar3[3]._M_string_length) goto LAB_00330e2d;
          if (__n != 0) {
            iVar5 = bcmp((pbVar1->_M_dataplus)._M_p,pbVar3[3]._M_dataplus._M_p,__n);
            bVar6 = iVar5 != 0;
            goto LAB_00330e29;
          }
          goto LAB_00330e53;
        }
        if (__n != pbVar3[3]._M_string_length) goto LAB_00330e53;
        if (__n != 0) {
          iVar5 = bcmp((pbVar1->_M_dataplus)._M_p,pbVar3[3]._M_dataplus._M_p,__n);
          bVar6 = iVar5 == 0;
          goto LAB_00330e29;
        }
LAB_00330e2d:
        value = "1";
      }
      bVar6 = true;
      cmMakefile::AddDefinition((this->super_cmCommand).Makefile,pbVar3 + 4,value);
      goto LAB_00330e68;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"sub-command COMPARE, mode ","");
    std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_50);
    cmCommand::SetError(&this->super_cmCommand,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_00330d82;
  }
  else {
    std::operator+(&local_50,"sub-command COMPARE does not recognize mode ",&local_70);
    cmCommand::SetError(&this->super_cmCommand,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_00330d82:
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  bVar6 = false;
LAB_00330e68:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool cmStringCommand::HandleCompareCommand(std::vector<std::string> const&
                                           args)
{
  if(args.size() < 2)
    {
    this->SetError("sub-command COMPARE requires a mode to be specified.");
    return false;
    }
  std::string mode = args[1];
  if((mode == "EQUAL") || (mode == "NOTEQUAL") ||
     (mode == "LESS") || (mode == "GREATER"))
    {
    if(args.size() < 5)
      {
      std::string e = "sub-command COMPARE, mode ";
      e += mode;
      e += " needs at least 5 arguments total to command.";
      this->SetError(e);
      return false;
      }

    const std::string& left = args[2];
    const std::string& right = args[3];
    const std::string& outvar = args[4];
    bool result;
    if(mode == "LESS")
      {
      result = (left < right);
      }
    else if(mode == "GREATER")
      {
      result = (left > right);
      }
    else if(mode == "EQUAL")
      {
      result = (left == right);
      }
    else // if(mode == "NOTEQUAL")
      {
      result = !(left == right);
      }
    if(result)
      {
      this->Makefile->AddDefinition(outvar, "1");
      }
    else
      {
      this->Makefile->AddDefinition(outvar, "0");
      }
    return true;
    }
  std::string e = "sub-command COMPARE does not recognize mode "+mode;
  this->SetError(e);
  return false;
}